

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::BuildFbVector(ChSystemDescriptor *this,ChVectorDynamic<> *Fvector)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChVariables *pCVar3;
  int iVar4;
  int n;
  size_t iv;
  long lVar5;
  ChVectorRef local_80;
  Type local_68;
  
  iVar4 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar4;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4);
  ppCVar1 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    pCVar3 = (this->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5];
    if (pCVar3->disabled == false) {
      ChVariables::Get_fb(&local_80,pCVar3);
      pCVar3 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
      iVar4 = pCVar3->offset;
      n = (*pCVar3->_vptr_ChVariables[2])();
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fvector,(long)iVar4
                 ,n);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                 &local_80);
    }
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::BuildFbVector(ChVectorDynamic<>& Fvector) {
    n_q = CountActiveVariables();
    Fvector.setZero(n_q);

    auto vv_size = vvariables.size();

    // Fills the 'f' vector
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            Fvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();
        }
    }
    return n_q;
}